

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QDate *date)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 jd;
  quint32 *in_stack_ffffffffffffffc8;
  QDataStream *in_stack_ffffffffffffffd0;
  QDataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QDataStream::version(in_RDI);
  if (iVar2 < 0xd) {
    QDataStream::operator>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *in_RSI = 0xaaaaaaaa;
  }
  else {
    QDataStream::operator>>(in_stack_ffffffffffffffd8,(qint64 *)in_stack_ffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QDate &date)
{
    if (in.version() < QDataStream::Qt_5_0) {
        quint32 jd;
        in >> jd;
        // Older versions consider 0 an invalid jd.
        date.jd = (jd != 0 ? jd : QDate::nullJd());
    } else {
        in >> date.jd;
    }

    return in;
}